

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast_pybind_p_rob3.cpp
# Opt level: O0

PyObject * PyInit_ikfast_p_rob3(void)

{
  int iVar1;
  char *__s1;
  PyObject **ppPVar2;
  error_already_set *e;
  exception *e_1;
  handle local_30;
  module m;
  size_t len;
  char *runtime_ver;
  char *compiled_ver;
  
  __s1 = (char *)Py_GetVersion();
  m.super_object.super_handle.m_ptr = (object)strlen("3.10");
  iVar1 = strncmp(__s1,"3.10",(size_t)m.super_object.super_handle.m_ptr);
  if ((iVar1 == 0) &&
     ((__s1[(long)m.super_object.super_handle.m_ptr] < '0' ||
      ('9' < __s1[(long)m.super_object.super_handle.m_ptr])))) {
    pybind11::module::module((module *)&local_30,"ikfast_p_rob3",(char *)0x0);
    pybind11_init_ikfast_p_rob3((module *)&local_30);
    ppPVar2 = pybind11::handle::ptr(&local_30);
    compiled_ver = (char *)*ppPVar2;
    pybind11::module::~module((module *)&local_30);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    compiled_ver = (char *)0x0;
  }
  return (PyObject *)compiled_ver;
}

Assistant:

PYBIND11_MODULE(ikfast_p_rob3, m)
{
    m.doc() = R"pbdoc(
        ikfast_pybind_p_rob3
        -----------------------
        .. currentmodule:: ikfast_pybind_p_rob3
        .. autosummary::
           :toctree: _generate
           get_ik
           get_fk
    )pbdoc";

    m.def("get_ik", [](const std::vector<double> &trans_list,
                       const std::vector<std::vector<double>> &rot_list)
    {
      using namespace ikfast;
      IkSolutionList<double> solutions;

      std::vector<double> vfree(GetNumFreeParameters());
      double eerot[9], eetrans[3];

      for(std::size_t i = 0; i < 3; ++i)
      {
          eetrans[i] = trans_list[i];
          std::vector<double> rot_vec = rot_list[i];
          for(std::size_t j = 0; j < 3; ++j)
          {
              eerot[3*i + j] = rot_vec[j];
          }
      }

      // call ikfast routine
      bool b_success = ComputeIk(eetrans, eerot, &vfree[0], solutions);

      std::vector<std::vector<double>> solution_list;
      if (!b_success)
      {
          //fprintf(stderr,"Failed to get ik solution\n");
          return solution_list; // Equivalent to returning None in python
      }

      std::vector<double> solvalues(GetNumJoints());

      // convert all ikfast solutions into a std::vector
      for(std::size_t i = 0; i < solutions.GetNumSolutions(); ++i)
      {
          const IkSolutionBase<double>& sol = solutions.GetSolution(i);
          std::vector<double> vsolfree(sol.GetFree().size());
          sol.GetSolution(&solvalues[0],
                          vsolfree.size() > 0 ? &vsolfree[0] : NULL);

          std::vector<double> individual_solution = std::vector<double>(GetNumJoints());
          for(std::size_t j = 0; j < solvalues.size(); ++j)
          {
              individual_solution[j] = solvalues[j];
          }
          solution_list.push_back(individual_solution);
      }
      return solution_list;
    },
    py::arg("trans_list"),
    py::arg("rot_list"),
    R"pbdoc(
        get inverse kinematic solutions for pybind_p_rob3
    )pbdoc");

    m.def("get_fk", [](const std::vector<double> &joint_list)
    {
      using namespace ikfast;
      // eerot is a flattened 3x3 rotation matrix
      double eerot[9], eetrans[3];

      std::vector<double> joints(GetNumJoints());
      for(std::size_t i = 0; i < GetNumJoints(); ++i)
      {
          joints[i] = joint_list[i];
      }

      // call ikfast routine
      ComputeFk(&joints[0], eetrans, eerot);

      // convert computed EE pose to a python object
      std::vector<double> pos(3);
      std::vector<std::vector<double>> rot(3);

      for(std::size_t i = 0; i < 3; ++i)
      {
          pos[i] = eetrans[i];
          std::vector<double> rot_vec(3);
          for( std::size_t j = 0; j < 3; ++j)
          {
              rot_vec[j] = eerot[3*i + j];
          }
          rot[i] = rot_vec;
      }
      return std::make_tuple(pos, rot);
    },
    py::arg("joint_list"),
    R"pbdoc(
        get forward kinematic solutions for kuka_kr6_r900
    )pbdoc");

    m.def("get_dof", []()
    {
      return int(GetNumJoints());
    },
    R"pbdoc(
        get number dofs configured for the ikfast module
    )pbdoc");

    m.def("get_free_dof", []()
    {
      return int(GetNumFreeParameters());
    },
    R"pbdoc(
        get number of free dofs configured for the ikfast module
    )pbdoc");

#ifdef VERSION_INFO
    m.attr("__version__") = VERSION_INFO;
#else
    m.attr("__version__") = "dev";
#endif

}